

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_REV(DisasContext_conflict1 *s,arg_rr *a)

{
  ulong uVar1;
  
  uVar1 = s->features;
  if ((uVar1 & 8) != 0) {
    op_rr(s,a,tcg_gen_bswap32_i32_aarch64);
  }
  return SUB41(((uint)uVar1 & 8) >> 3,0);
}

Assistant:

static bool trans_REV(DisasContext *s, arg_rr *a)
{
    if (!ENABLE_ARCH_6) {
        return false;
    }
    return op_rr(s, a, tcg_gen_bswap32_i32);
}